

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsSceneCreator.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::KinematicsSceneCreator::KinematicsSceneCreator
          (KinematicsSceneCreator *this,DocumentProcessor *documentProcessor)

{
  _Rb_tree_header *p_Var1;
  allocator_type local_1e;
  equal_to<COLLADASaxFWL::KinematicsModel_*> local_1d;
  hash<COLLADASaxFWL::KinematicsModel_*> local_1c;
  _Select1st<std::pair<COLLADASaxFWL::KinematicsModel_*const,_COLLADAFW::KinematicsModel_*>_>
  local_1b;
  _Default_ranged_hash local_1a;
  _Mod_range_hashing local_19;
  
  this->_vptr_KinematicsSceneCreator = (_func_int **)&PTR__KinematicsSceneCreator_00908c58;
  this->mKinematicsScene = (KinematicsScene *)0x0;
  this->mDocumentProcessor = documentProcessor;
  this->mKinematicsIntermediateData = documentProcessor->mKinematicsIntermediateData;
  this->mLargestLinkNumber = 0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->mLinkNumberStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&this->mLinkNumberStack,0
            );
  this->mLargestJointIndex = 0;
  p_Var1 = &(this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::tr1::
  _Hashtable<COLLADASaxFWL::KinematicsModel_*,_std::pair<COLLADASaxFWL::KinematicsModel_*const,_COLLADAFW::KinematicsModel_*>,_std::allocator<std::pair<COLLADASaxFWL::KinematicsModel_*const,_COLLADAFW::KinematicsModel_*>_>,_std::_Select1st<std::pair<COLLADASaxFWL::KinematicsModel_*const,_COLLADAFW::KinematicsModel_*>_>,_std::equal_to<COLLADASaxFWL::KinematicsModel_*>,_std::tr1::hash<COLLADASaxFWL::KinematicsModel_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::_Hashtable((_Hashtable<COLLADASaxFWL::KinematicsModel_*,_std::pair<COLLADASaxFWL::KinematicsModel_*const,_COLLADAFW::KinematicsModel_*>,_std::allocator<std::pair<COLLADASaxFWL::KinematicsModel_*const,_COLLADAFW::KinematicsModel_*>_>,_std::_Select1st<std::pair<COLLADASaxFWL::KinematicsModel_*const,_COLLADAFW::KinematicsModel_*>_>,_std::equal_to<COLLADASaxFWL::KinematicsModel_*>,_std::tr1::hash<COLLADASaxFWL::KinematicsModel_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                *)&this->mKinematicsModelFWKinematicsModelMap,10,&local_1c,&local_19,&local_1a,
               &local_1d,&local_1b,&local_1e);
  p_Var1 = &(this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

KinematicsSceneCreator::KinematicsSceneCreator( DocumentProcessor* documentProcessor )
		: mKinematicsScene(0)
		, mDocumentProcessor(documentProcessor)
		, mKinematicsIntermediateData( documentProcessor->getKinematicsIntermediateData())
		, mLargestLinkNumber(0)
		, mLargestJointIndex(0)
	{

	}